

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_header_parser.cc
# Opt level: O0

bool __thiscall
vp9_parser::Vp9HeaderParser::SetFrame(Vp9HeaderParser *this,uint8_t *frame,size_t length)

{
  size_t length_local;
  uint8_t *frame_local;
  Vp9HeaderParser *this_local;
  
  if ((frame == (uint8_t *)0x0) || (length == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this->frame_ = frame;
    this->frame_size_ = length;
    this->bit_offset_ = 0;
    this->profile_ = -1;
    this->show_existing_frame_ = 0;
    this->key_ = 0;
    this->altref_ = 0;
    this->error_resilient_mode_ = 0;
    this->intra_only_ = 0;
    this->reset_frame_context_ = 0;
    this->color_space_ = 0;
    this->color_range_ = 0;
    this->subsampling_x_ = 0;
    this->subsampling_y_ = 0;
    this->refresh_frame_flags_ = 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Vp9HeaderParser::SetFrame(const uint8_t* frame, size_t length) {
  if (!frame || length == 0)
    return false;

  frame_ = frame;
  frame_size_ = length;
  bit_offset_ = 0;
  profile_ = -1;
  show_existing_frame_ = 0;
  key_ = 0;
  altref_ = 0;
  error_resilient_mode_ = 0;
  intra_only_ = 0;
  reset_frame_context_ = 0;
  color_space_ = 0;
  color_range_ = 0;
  subsampling_x_ = 0;
  subsampling_y_ = 0;
  refresh_frame_flags_ = 0;
  return true;
}